

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrMultisamplePixelBufferAccess.cpp
# Opt level: O2

void rr::resolveMultisampleColorBuffer
               (PixelBufferAccess *dst,MultisampleConstPixelBufferAccess *src)

{
  Vector<float,_4> *this;
  int iVar1;
  int s;
  int y_00;
  int y;
  int y_01;
  int x;
  int x_00;
  Vec4 sum;
  undefined1 local_68 [16];
  ConstPixelBufferAccess local_58;
  
  iVar1 = (src->m_access).m_size.m_data[0];
  if (iVar1 == 1) {
    MultisampleConstPixelBufferAccess::toSinglesampleAccess
              ((ConstPixelBufferAccess *)(local_68 + 0x10),src);
    tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)(local_68 + 0x10));
  }
  else {
    this = (Vector<float,_4> *)(local_68 + 0x10);
    for (y_01 = 0; y_01 < (dst->super_ConstPixelBufferAccess).m_size.m_data[1]; y_01 = y_01 + 1) {
      for (x_00 = 0; x_00 < (dst->super_ConstPixelBufferAccess).m_size.m_data[0]; x_00 = x_00 + 1) {
        tcu::Vector<float,_4>::Vector(this);
        for (y_00 = 0; y_00 < (src->m_access).m_size.m_data[0]; y_00 = y_00 + 1) {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_68,(int)src,y_00,x_00);
          tcu::Vector<float,_4>::operator+=(this,(Vector<float,_4> *)local_68);
        }
        tcu::operator*((tcu *)local_68,1.0 / (float)iVar1,this);
        tcu::PixelBufferAccess::setPixel(dst,(Vec4 *)local_68,x_00,y_01,0);
      }
    }
  }
  return;
}

Assistant:

void resolveMultisampleColorBuffer (const tcu::PixelBufferAccess& dst, const MultisampleConstPixelBufferAccess& src)
{
	DE_ASSERT(dst.getWidth() == src.raw().getHeight());
	DE_ASSERT(dst.getHeight() == src.raw().getDepth());

	if (src.getNumSamples() == 1)
	{
		// fast-path for non-multisampled cases
		tcu::copy(dst, src.toSinglesampleAccess());
	}
	else
	{
		const float numSamplesInv = 1.0f / (float)src.getNumSamples();

		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
		{
			tcu::Vec4 sum;
			for (int s = 0; s < src.raw().getWidth(); s++)
				sum += src.raw().getPixel(s, x, y);

			dst.setPixel(sum*numSamplesInv, x, y);
		}
	}
}